

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

void getopt_destroy(getopt_t *gopt)

{
  zarray_t *pzVar1;
  
  zarray_vmap(gopt->extraargs,free);
  pzVar1 = gopt->extraargs;
  if (pzVar1 != (zarray_t *)0x0) {
    if (pzVar1->data != (char *)0x0) {
      free(pzVar1->data);
    }
    free(pzVar1);
  }
  zarray_vmap(gopt->options,getopt_option_destroy);
  pzVar1 = gopt->options;
  if (pzVar1 != (zarray_t *)0x0) {
    if (pzVar1->data != (char *)0x0) {
      free(pzVar1->data);
    }
    free(pzVar1);
  }
  zhash_destroy(gopt->lopts);
  zhash_destroy(gopt->sopts);
  free(gopt);
  return;
}

Assistant:

void getopt_destroy(getopt_t *gopt)
{
    // free the extra arguments and container
    zarray_vmap(gopt->extraargs, free);
    zarray_destroy(gopt->extraargs);

    // deep free of the getopt_option structs. Also frees key/values, so
    // after this loop, hash tables will no longer work
    zarray_vmap(gopt->options, getopt_option_destroy);
    zarray_destroy(gopt->options);

    // free tables
    zhash_destroy(gopt->lopts);
    zhash_destroy(gopt->sopts);

    memset(gopt, 0, sizeof(getopt_t));
    free(gopt);
}